

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O0

void dumpNinjaManifestJSON(StringRef file,Manifest *manifest)

{
  Command *this;
  bool bVar1;
  uint uVar2;
  DepsStyleKind DVar3;
  ostream *poVar4;
  Scope *pSVar5;
  StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
  *pSVar6;
  iterator iVar7;
  iterator iVar8;
  StringMapImpl *this_00;
  pool_set *this_01;
  StringMapEntry<llbuild::ninja::Pool_*> *this_02;
  Pool **__x;
  iterator iVar9;
  iterator iVar10;
  reference ppPVar11;
  rule_set *this_03;
  StringMapEntry<llbuild::ninja::Rule_*> *this_04;
  Rule **__x_00;
  iterator iVar12;
  iterator iVar13;
  reference ppRVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  pointer ppVar16;
  vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *pvVar17;
  iterator iVar18;
  iterator iVar19;
  reference ppNVar20;
  vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> *__x_01;
  iterator iVar21;
  iterator iVar22;
  reference ppCVar23;
  Rule *this_05;
  string *psVar24;
  reference ppNVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_13;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  Pool *local_4e8;
  Pool *executionPool;
  __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_4c0;
  __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_4b8;
  const_iterator ie_8;
  const_iterator it_8;
  __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_488;
  __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_480;
  const_iterator ie_7;
  const_iterator it_7;
  __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_450;
  __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_448;
  const_iterator ie_6;
  const_iterator it_6;
  __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_418;
  __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_410;
  const_iterator ie_5;
  const_iterator it_5;
  Command *command;
  iterator ie_4;
  iterator it_4;
  undefined1 local_3c8 [8];
  vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> commands;
  __normal_iterator<llbuild::ninja::Node_**,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_390;
  __normal_iterator<llbuild::ninja::Node_**,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
  local_388;
  iterator ie_3;
  iterator it_3;
  undefined1 local_360 [8];
  vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> defaultTargets;
  string local_328;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_308;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_300;
  iterator pie;
  iterator pit;
  StringRef local_2e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_290;
  StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry_3;
  iterator __end2_1;
  iterator __begin2_1;
  StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
  *__range2_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parameters;
  __normal_iterator<llbuild::ninja::Rule_**,_std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>_>
  local_238;
  Rule *local_230;
  Rule *rule;
  iterator ie_2;
  iterator it_2;
  StringMapEntry<llbuild::ninja::Rule_*> *entry_2;
  iterator __end1_1;
  iterator __begin1_1;
  rule_set *__range1_1;
  vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> rules;
  undefined1 local_1c0 [4];
  uint32_t depth;
  __normal_iterator<llbuild::ninja::Pool_**,_std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>_>
  local_1a0;
  Pool *local_198;
  Pool *pool;
  iterator ie_1;
  iterator it_1;
  StringMapEntry<llbuild::ninja::Pool_*> *entry_1;
  iterator __end2;
  iterator __begin2;
  pool_set *__range2;
  vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> pools;
  string local_110;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_e8;
  iterator ie;
  iterator it;
  StringRef local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_78;
  StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *entry;
  const_iterator __end1;
  const_iterator __begin1;
  StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
  *__range1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bindings;
  Manifest *manifest_local;
  StringRef file_local;
  
  file_local.Data = (char *)file.Length;
  manifest_local = (Manifest *)file.Data;
  std::operator<<((ostream *)&std::cout,"{\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"  \"filename\": \"");
  llbuild::basic::escapeForJSON<llvm::StringRef>
            ((string *)
             &bindings.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(StringRef *)&manifest_local);
  poVar4 = std::operator<<(poVar4,(string *)
                                  &bindings.
                                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar4,"\",\n");
  std::__cxx11::string::~string
            ((string *)
             &bindings.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar5 = llbuild::ninja::Manifest::getRootScope(manifest);
  pSVar5 = llbuild::ninja::Scope::getParent(pSVar5);
  if (pSVar5 != (Scope *)0x0) {
    __assert_fail("manifest->getRootScope().getParent() == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaCommand.cpp"
                  ,0x263,"void dumpNinjaManifestJSON(StringRef, ninja::Manifest *)");
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&__range1);
  pSVar5 = llbuild::ninja::Manifest::getRootScope(manifest);
  pSVar6 = llbuild::ninja::Scope::getBindings_abi_cxx11_(pSVar5);
  __end1 = llvm::
           StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
           ::begin(pSVar6);
  entry = (StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)llvm::
             StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
             ::end(pSVar6);
  while (bVar1 = llvm::
                 iterator_facade_base<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_long,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                 ::operator!=((iterator_facade_base<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_long,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                               *)&__end1,
                              (StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&entry), bVar1) {
    local_78 = llvm::
               StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    local_c8 = llvm::
               StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::getKey(local_78);
    pbVar15 = llvm::
              StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::getValue(local_78);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<llvm::StringRef,_true>(&local_b8,&local_c8,pbVar15);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range1,&local_b8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_b8);
    llvm::
    StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1.
                  super_StringMapIterBase<llvm::StringMapConstIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
  }
  iVar7 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range1);
  iVar8 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range1);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
            ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )iVar7._M_current,
             (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )iVar8._M_current);
  std::operator<<((ostream *)&std::cout,"  \"bindings\": {\n");
  ie = std::
       vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__range1);
  local_e8._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=(&ie,&local_e8), bVar1) {
    local_f0._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&__range1);
    bVar1 = __gnu_cxx::operator!=(&ie,&local_f0);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,",\n");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"    \"");
    ppVar16 = __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator->(&ie);
    llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_110,(basic *)ppVar16,in);
    poVar4 = std::operator<<(poVar4,(string *)&local_110);
    poVar4 = std::operator<<(poVar4,"\": \"");
    ppVar16 = __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator->(&ie);
    llbuild::basic::escapeForJSON<std::__cxx11::string>
              ((string *)
               &pools.
                super__Vector_base<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(basic *)&ppVar16->second,in_00);
    poVar4 = std::operator<<(poVar4,(string *)
                                    &pools.
                                     super__Vector_base<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar4,"\"");
    std::__cxx11::string::~string
              ((string *)
               &pools.
                super__Vector_base<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_110);
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&ie);
  }
  std::operator<<((ostream *)&std::cout,"\n  },\n");
  this_00 = &llbuild::ninja::Manifest::getPools(manifest)->super_StringMapImpl;
  bVar1 = llvm::StringMapImpl::empty(this_00);
  if (!bVar1) {
    std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::vector
              ((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *)&__range2)
    ;
    this_01 = llbuild::ninja::Manifest::getPools(manifest);
    __end2 = llvm::StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator>::begin(this_01);
    entry_1 = (StringMapEntry<llbuild::ninja::Pool_*> *)
              llvm::StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator>::end(this_01);
    while (bVar1 = llvm::
                   iterator_facade_base<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llbuild::ninja::Pool_*>,_long,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_*,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_&>
                   ::operator!=((iterator_facade_base<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llbuild::ninja::Pool_*>,_long,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_*,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_&>
                                 *)&__end2,(StringMapIterator<llbuild::ninja::Pool_*> *)&entry_1),
          bVar1) {
      this_02 = llvm::StringMapIterator<llbuild::ninja::Pool_*>::operator*(&__end2);
      __x = llvm::StringMapEntry<llbuild::ninja::Pool_*>::getValue(this_02);
      std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::push_back
                ((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *)
                 &__range2,__x);
      llvm::
      StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
      ::operator++(&__end2.
                    super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Pool_*>,_llvm::StringMapEntry<llbuild::ninja::Pool_*>_>
                  );
    }
    iVar9 = std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::begin
                      ((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *)
                       &__range2);
    iVar10 = std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::end
                       ((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *)
                        &__range2);
    std::
    sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Pool**,std::vector<llbuild::ninja::Pool*,std::allocator<llbuild::ninja::Pool*>>>,dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__0>
              (iVar9._M_current,iVar10._M_current);
    std::operator<<((ostream *)&std::cout,"  \"pools\": {\n");
    ie_1 = std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::begin
                     ((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *)
                      &__range2);
    pool = (Pool *)std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::end
                             ((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>
                               *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&ie_1,(__normal_iterator<llbuild::ninja::Pool_**,_std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>_>
                                     *)&pool), bVar1) {
      ppPVar11 = __gnu_cxx::
                 __normal_iterator<llbuild::ninja::Pool_**,_std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>_>
                 ::operator*(&ie_1);
      local_198 = *ppPVar11;
      local_1a0._M_current =
           (Pool **)std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::
                    begin((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *
                          )&__range2);
      bVar1 = __gnu_cxx::operator!=(&ie_1,&local_1a0);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,",\n");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"    \"");
      psVar24 = llbuild::ninja::Pool::getName_abi_cxx11_(local_198);
      llbuild::basic::escapeForJSON<std::__cxx11::string>
                ((string *)local_1c0,(basic *)psVar24,in_01);
      poVar4 = std::operator<<(poVar4,(string *)local_1c0);
      std::operator<<(poVar4,"\": {");
      std::__cxx11::string::~string((string *)local_1c0);
      rules.super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           llbuild::ninja::Pool::getDepth(local_198);
      if (rules.super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"\n      \"depth\": ");
        std::ostream::operator<<
                  (poVar4,rules.
                          super__Vector_base<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      }
      std::operator<<((ostream *)&std::cout,"\n    }");
      __gnu_cxx::
      __normal_iterator<llbuild::ninja::Pool_**,_std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>_>
      ::operator++(&ie_1);
    }
    std::operator<<((ostream *)&std::cout,"\n  },\n");
    std::vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_>::~vector
              ((vector<llbuild::ninja::Pool_*,_std::allocator<llbuild::ninja::Pool_*>_> *)&__range2)
    ;
  }
  std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::vector
            ((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> *)&__range1_1)
  ;
  pSVar5 = llbuild::ninja::Manifest::getRootScope(manifest);
  this_03 = llbuild::ninja::Scope::getRules(pSVar5);
  __end1_1 = llvm::StringMap<llbuild::ninja::Rule_*,_llvm::MallocAllocator>::begin(this_03);
  entry_2 = (StringMapEntry<llbuild::ninja::Rule_*> *)
            llvm::StringMap<llbuild::ninja::Rule_*,_llvm::MallocAllocator>::end(this_03);
  while (bVar1 = llvm::
                 iterator_facade_base<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llbuild::ninja::Rule_*>,_long,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_*,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_&>
                 ::operator!=((iterator_facade_base<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llbuild::ninja::Rule_*>,_long,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_*,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_&>
                               *)&__end1_1,(StringMapIterator<llbuild::ninja::Rule_*> *)&entry_2),
        bVar1) {
    this_04 = llvm::StringMapIterator<llbuild::ninja::Rule_*>::operator*(&__end1_1);
    __x_00 = llvm::StringMapEntry<llbuild::ninja::Rule_*>::getValue(this_04);
    std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::push_back
              ((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> *)
               &__range1_1,__x_00);
    llvm::
    StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_>
    ::operator++(&__end1_1.
                  super_StringMapIterBase<llvm::StringMapIterator<llbuild::ninja::Rule_*>,_llvm::StringMapEntry<llbuild::ninja::Rule_*>_>
                );
  }
  iVar12 = std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::begin
                     ((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> *)
                      &__range1_1);
  iVar13 = std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::end
                     ((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> *)
                      &__range1_1);
  std::
  sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Rule**,std::vector<llbuild::ninja::Rule*,std::allocator<llbuild::ninja::Rule*>>>,dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__1>
            (iVar12._M_current,iVar13._M_current);
  std::operator<<((ostream *)&std::cout,"  \"rules\": {\n");
  ie_2 = std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::begin
                   ((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> *)
                    &__range1_1);
  rule = (Rule *)std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::end
                           ((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>
                             *)&__range1_1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&ie_2,(__normal_iterator<llbuild::ninja::Rule_**,_std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>_>
                                   *)&rule), bVar1) {
    ppRVar14 = __gnu_cxx::
               __normal_iterator<llbuild::ninja::Rule_**,_std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>_>
               ::operator*(&ie_2);
    local_230 = *ppRVar14;
    local_238._M_current =
         (Rule **)std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::
                  begin((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> *)
                        &__range1_1);
    bVar1 = __gnu_cxx::operator!=(&ie_2,&local_238);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,",\n");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"    \"");
    psVar24 = llbuild::ninja::Rule::getName_abi_cxx11_(local_230);
    llbuild::basic::escapeForJSON<std::__cxx11::string>
              ((string *)
               &parameters.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(basic *)psVar24,in_02);
    poVar4 = std::operator<<(poVar4,(string *)
                                    &parameters.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar4,"\": {\n");
    std::__cxx11::string::~string
              ((string *)
               &parameters.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range2_1);
    pSVar6 = llbuild::ninja::Rule::getParameters_abi_cxx11_(local_230);
    __end2_1 = llvm::
               StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
               ::begin(pSVar6);
    entry_3 = (StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)llvm::
                 StringMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llvm::MallocAllocator>
                 ::end(pSVar6);
    while (bVar1 = llvm::
                   iterator_facade_base<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_long,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                   ::operator!=((iterator_facade_base<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_long,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                                 *)&__end2_1,
                                (StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&entry_3), bVar1) {
      local_290 = llvm::
                  StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&__end2_1);
      local_2e0 = llvm::
                  StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::getKey(local_290);
      pbVar15 = llvm::
                StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::getValue(local_290);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<llvm::StringRef,_true>(&local_2d0,&local_2e0,pbVar15);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range2_1,&local_2d0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_2d0);
      llvm::
      StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2_1.
                    super_StringMapIterBase<llvm::StringMapIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_llvm::StringMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
    }
    iVar7 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&__range2_1);
    iVar8 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range2_1);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>>
              ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )iVar7._M_current,
               (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                )iVar8._M_current);
    pie = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range2_1);
    local_300._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__range2_1);
    while (bVar1 = __gnu_cxx::operator!=(&pie,&local_300), bVar1) {
      local_308._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&__range2_1);
      bVar1 = __gnu_cxx::operator!=(&pie,&local_308);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,",\n");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"      \"");
      ppVar16 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator->(&pie);
      llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_328,(basic *)ppVar16,in_03);
      poVar4 = std::operator<<(poVar4,(string *)&local_328);
      poVar4 = std::operator<<(poVar4,"\": \"");
      ppVar16 = __gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator->(&pie);
      llbuild::basic::escapeForJSON<std::__cxx11::string>
                ((string *)
                 &defaultTargets.
                  super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(basic *)&ppVar16->second,in_04
                );
      poVar4 = std::operator<<(poVar4,(string *)
                                      &defaultTargets.
                                       super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar4,"\"");
      std::__cxx11::string::~string
                ((string *)
                 &defaultTargets.
                  super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_328);
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&pie);
    }
    std::operator<<((ostream *)&std::cout,"\n    }");
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__range2_1);
    __gnu_cxx::
    __normal_iterator<llbuild::ninja::Rule_**,_std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>_>
    ::operator++(&ie_2);
  }
  std::operator<<((ostream *)&std::cout,"\n  },\n");
  pvVar17 = llbuild::ninja::Manifest::getDefaultTargets(manifest);
  bVar1 = std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::empty
                    (pvVar17);
  if (!bVar1) {
    pvVar17 = llbuild::ninja::Manifest::getDefaultTargets(manifest);
    std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::vector
              ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)local_360,
               pvVar17);
    iVar18 = std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::begin
                       ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                        local_360);
    iVar19 = std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::end
                       ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                        local_360);
    std::
    sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Node**,std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>>,dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__2>
              (iVar18._M_current,iVar19._M_current);
    std::operator<<((ostream *)&std::cout,"  \"default_targets\": [");
    ie_3 = std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::begin
                     ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)
                      local_360);
    local_388._M_current =
         (Node **)std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::end
                            ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                              *)local_360);
    while (bVar1 = __gnu_cxx::operator!=(&ie_3,&local_388), bVar1) {
      local_390._M_current =
           (Node **)std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::
                    begin((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *
                          )local_360);
      bVar1 = __gnu_cxx::operator!=(&ie_3,&local_390);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,", ");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"\"");
      ppNVar20 = __gnu_cxx::
                 __normal_iterator<llbuild::ninja::Node_**,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
                 ::operator*(&ie_3);
      psVar24 = llbuild::ninja::Node::getScreenPath_abi_cxx11_(*ppNVar20);
      llbuild::basic::escapeForJSON<std::__cxx11::string>
                ((string *)
                 &commands.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(basic *)psVar24,in_05);
      poVar4 = std::operator<<(poVar4,(string *)
                                      &commands.
                                       super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar4,"\"");
      std::__cxx11::string::~string
                ((string *)
                 &commands.
                  super__Vector_base<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __gnu_cxx::
      __normal_iterator<llbuild::ninja::Node_**,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
      ::operator++(&ie_3);
    }
    std::operator<<((ostream *)&std::cout,"],\n");
    std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::~vector
              ((vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_> *)local_360)
    ;
  }
  __x_01 = llbuild::ninja::Manifest::getCommands(manifest);
  std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::vector
            ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> *)
             local_3c8,__x_01);
  iVar21 = std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::begin
                     ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       *)local_3c8);
  iVar22 = std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::end
                     ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                       *)local_3c8);
  std::
  sort<__gnu_cxx::__normal_iterator<llbuild::ninja::Command**,std::vector<llbuild::ninja::Command*,std::allocator<llbuild::ninja::Command*>>>,dumpNinjaManifestJSON(llvm::StringRef,llbuild::ninja::Manifest*)::__3>
            (iVar21._M_current,iVar22._M_current);
  std::operator<<((ostream *)&std::cout,"  \"commands\": [\n");
  ie_4 = std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::begin
                   ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> *
                    )local_3c8);
  command = (Command *)
            std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::end
                      ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                        *)local_3c8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&ie_4,(__normal_iterator<llbuild::ninja::Command_**,_std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>_>
                                   *)&command), bVar1) {
    ppCVar23 = __gnu_cxx::
               __normal_iterator<llbuild::ninja::Command_**,_std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>_>
               ::operator*(&ie_4);
    this = *ppCVar23;
    it_5._M_current =
         (Node **)std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                  ::begin((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>
                           *)local_3c8);
    bVar1 = __gnu_cxx::operator!=
                      (&ie_4,(__normal_iterator<llbuild::ninja::Command_**,_std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>_>
                              *)&it_5);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,",\n");
    }
    std::operator<<((ostream *)&std::cout,"    {\n");
    std::operator<<((ostream *)&std::cout,"      \"outputs\": [");
    pvVar17 = llbuild::ninja::Command::getOutputs(this);
    ie_5 = std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::begin
                     (pvVar17);
    pvVar17 = llbuild::ninja::Command::getOutputs(this);
    local_410._M_current =
         (Node **)std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::end
                            (pvVar17);
    while (bVar1 = __gnu_cxx::operator!=(&ie_5,&local_410), bVar1) {
      pvVar17 = llbuild::ninja::Command::getOutputs(this);
      local_418._M_current =
           (Node **)std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::
                    begin(pvVar17);
      bVar1 = __gnu_cxx::operator!=(&ie_5,&local_418);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,", ");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"\"");
      ppNVar25 = __gnu_cxx::
                 __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
                 ::operator*(&ie_5);
      psVar24 = llbuild::ninja::Node::getScreenPath_abi_cxx11_(*ppNVar25);
      llbuild::basic::escapeForJSON<std::__cxx11::string>((string *)&it_6,(basic *)psVar24,in_06);
      poVar4 = std::operator<<(poVar4,(string *)&it_6);
      std::operator<<(poVar4,"\"");
      std::__cxx11::string::~string((string *)&it_6);
      __gnu_cxx::
      __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
      ::operator++(&ie_5);
    }
    std::operator<<((ostream *)&std::cout,"],\n");
    poVar4 = std::operator<<((ostream *)&std::cout,"      \"rule\": \"");
    this_05 = llbuild::ninja::Command::getRule(this);
    psVar24 = llbuild::ninja::Rule::getName_abi_cxx11_(this_05);
    poVar4 = std::operator<<(poVar4,(string *)psVar24);
    std::operator<<(poVar4,"\",\n");
    std::operator<<((ostream *)&std::cout,"      \"inputs\": [");
    ie_6 = llbuild::ninja::Command::explicitInputs_begin(this);
    local_448._M_current = (Node **)llbuild::ninja::Command::explicitInputs_end(this);
    while (bVar1 = __gnu_cxx::operator!=(&ie_6,&local_448), bVar1) {
      local_450._M_current = (Node **)llbuild::ninja::Command::explicitInputs_begin(this);
      bVar1 = __gnu_cxx::operator!=(&ie_6,&local_450);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,", ");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"\"");
      ppNVar25 = __gnu_cxx::
                 __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
                 ::operator*(&ie_6);
      psVar24 = llbuild::ninja::Node::getScreenPath_abi_cxx11_(*ppNVar25);
      llbuild::basic::escapeForJSON<std::__cxx11::string>((string *)&it_7,(basic *)psVar24,in_07);
      poVar4 = std::operator<<(poVar4,(string *)&it_7);
      std::operator<<(poVar4,"\"");
      std::__cxx11::string::~string((string *)&it_7);
      __gnu_cxx::
      __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
      ::operator++(&ie_6);
    }
    std::operator<<((ostream *)&std::cout,"],\n");
    uVar2 = llbuild::ninja::Command::getNumImplicitInputs(this);
    if (uVar2 != 0) {
      std::operator<<((ostream *)&std::cout,"      \"implicit_inputs\": [");
      ie_7 = llbuild::ninja::Command::implicitInputs_begin(this);
      local_480._M_current = (Node **)llbuild::ninja::Command::implicitInputs_end(this);
      while (bVar1 = __gnu_cxx::operator!=(&ie_7,&local_480), bVar1) {
        local_488._M_current = (Node **)llbuild::ninja::Command::implicitInputs_begin(this);
        bVar1 = __gnu_cxx::operator!=(&ie_7,&local_488);
        if (bVar1) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"\"");
        ppNVar25 = __gnu_cxx::
                   __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
                   ::operator*(&ie_7);
        psVar24 = llbuild::ninja::Node::getScreenPath_abi_cxx11_(*ppNVar25);
        llbuild::basic::escapeForJSON<std::__cxx11::string>((string *)&it_8,(basic *)psVar24,in_08);
        poVar4 = std::operator<<(poVar4,(string *)&it_8);
        std::operator<<(poVar4,"\"");
        std::__cxx11::string::~string((string *)&it_8);
        __gnu_cxx::
        __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
        ::operator++(&ie_7);
      }
      std::operator<<((ostream *)&std::cout,"],\n");
    }
    uVar2 = llbuild::ninja::Command::getNumOrderOnlyInputs(this);
    if (uVar2 != 0) {
      std::operator<<((ostream *)&std::cout,"      \"order_only_inputs\": [");
      ie_8 = llbuild::ninja::Command::orderOnlyInputs_begin(this);
      local_4b8._M_current = (Node **)llbuild::ninja::Command::orderOnlyInputs_end(this);
      while (bVar1 = __gnu_cxx::operator!=(&ie_8,&local_4b8), bVar1) {
        local_4c0._M_current = (Node **)llbuild::ninja::Command::orderOnlyInputs_begin(this);
        bVar1 = __gnu_cxx::operator!=(&ie_8,&local_4c0);
        if (bVar1) {
          std::operator<<((ostream *)&std::cout,", ");
        }
        poVar4 = std::operator<<((ostream *)&std::cout,"\"");
        ppNVar25 = __gnu_cxx::
                   __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
                   ::operator*(&ie_8);
        psVar24 = llbuild::ninja::Node::getScreenPath_abi_cxx11_(*ppNVar25);
        llbuild::basic::escapeForJSON<std::__cxx11::string>
                  ((string *)&executionPool,(basic *)psVar24,in_09);
        poVar4 = std::operator<<(poVar4,(string *)&executionPool);
        std::operator<<(poVar4,"\"");
        std::__cxx11::string::~string((string *)&executionPool);
        __gnu_cxx::
        __normal_iterator<llbuild::ninja::Node_*const_*,_std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>_>
        ::operator++(&ie_8);
      }
      std::operator<<((ostream *)&std::cout,"],\n");
    }
    bVar1 = llbuild::ninja::Command::hasGeneratorFlag(this);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"      \"generator\": true,\n");
    }
    bVar1 = llbuild::ninja::Command::hasRestatFlag(this);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"      \"restat\": true,\n");
    }
    local_4e8 = llbuild::ninja::Command::getExecutionPool(this);
    if (local_4e8 != (Pool *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"      \"pool\": \"");
      psVar24 = llbuild::ninja::Pool::getName_abi_cxx11_(local_4e8);
      llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_508,(basic *)psVar24,in_10);
      poVar4 = std::operator<<(poVar4,(string *)&local_508);
      std::operator<<(poVar4,"\",\n");
      std::__cxx11::string::~string((string *)&local_508);
    }
    DVar3 = llbuild::ninja::Command::getDepsStyle(this);
    if (DVar3 != None) {
      if (DVar3 == GCC) {
        std::operator<<((ostream *)&std::cout,"      \"deps\": \"gcc\",\n");
        poVar4 = std::operator<<((ostream *)&std::cout,"      \"depfile\": \"");
        psVar24 = llbuild::ninja::Command::getDepsFile_abi_cxx11_(this);
        llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_528,(basic *)psVar24,in_11);
        poVar4 = std::operator<<(poVar4,(string *)&local_528);
        std::operator<<(poVar4,"\",\n");
        std::__cxx11::string::~string((string *)&local_528);
      }
      else if (DVar3 == MSVC) {
        std::operator<<((ostream *)&std::cout,"      \"deps\": \"msvc\",\n");
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"      \"command\": \"");
    psVar24 = llbuild::ninja::Command::getCommandString_abi_cxx11_(this);
    llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_548,(basic *)psVar24,in_12);
    poVar4 = std::operator<<(poVar4,(string *)&local_548);
    std::operator<<(poVar4,"\",\n");
    std::__cxx11::string::~string((string *)&local_548);
    poVar4 = std::operator<<((ostream *)&std::cout,"      \"description\": \"");
    psVar24 = llbuild::ninja::Command::getDescription_abi_cxx11_(this);
    llbuild::basic::escapeForJSON<std::__cxx11::string>(&local_568,(basic *)psVar24,in_13);
    poVar4 = std::operator<<(poVar4,(string *)&local_568);
    std::operator<<(poVar4,"\"\n");
    std::__cxx11::string::~string((string *)&local_568);
    std::operator<<((ostream *)&std::cout,"    }");
    __gnu_cxx::
    __normal_iterator<llbuild::ninja::Command_**,_std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>_>
    ::operator++(&ie_4);
  }
  std::operator<<((ostream *)&std::cout,"\n  ]\n");
  std::operator<<((ostream *)&std::cout,"}\n");
  std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::~vector
            ((vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_> *)
             local_3c8);
  std::vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_>::~vector
            ((vector<llbuild::ninja::Rule_*,_std::allocator<llbuild::ninja::Rule_*>_> *)&__range1_1)
  ;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&__range1);
  return;
}

Assistant:

static void dumpNinjaManifestJSON(StringRef file, ninja::Manifest* manifest) {
  std::cout << "{\n";
  std::cout << "  \"filename\": \"" << escapeForJSON(file) << "\",\n";

  // Dump the top-level bindings.
  assert(manifest->getRootScope().getParent() == nullptr);
  std::vector<std::pair<std::string, std::string>> bindings;
  for (const auto& entry: manifest->getRootScope().getBindings()) {
    bindings.push_back({ entry.getKey(), entry.getValue() });
  }
  std::sort(bindings.begin(), bindings.end());
  std::cout << "  \"bindings\": {\n";
  for (auto it = bindings.begin(), ie = bindings.end(); it != ie; ++it) {
    if (it != bindings.begin()) std::cout << ",\n";
    std::cout << "    \"" << escapeForJSON(it->first) << "\": \""
              << escapeForJSON(it->second) << "\"";
  }
  std::cout << "\n  },\n";
  
  // Dump the pools, if present.
  if (!manifest->getPools().empty()) {
    std::vector<ninja::Pool*> pools;
    for (const auto& entry: manifest->getPools()) {
      pools.push_back(entry.getValue());
    }
    std::sort(pools.begin(), pools.end(), [] (ninja::Pool* a, ninja::Pool* b) {
        return a->getName() < b->getName();
      });
    std::cout << "  \"pools\": {\n";
    for (auto it = pools.begin(), ie = pools.end(); it != ie; ++it) {
      auto pool = *it;
      if (it != pools.begin()) std::cout << ",\n";
      std::cout << "    \"" << escapeForJSON(pool->getName()) << "\": {";
      if (uint32_t depth = pool->getDepth()) {
        std::cout << "\n      \"depth\": " << depth;
      }
      std::cout << "\n    }";
    }
    std::cout << "\n  },\n";
  }

  // Dump the rules.
  std::vector<ninja::Rule*> rules;
  for (const auto& entry: manifest->getRootScope().getRules()) {
    rules.push_back(entry.getValue());
  }
  std::sort(rules.begin(), rules.end(), [] (ninja::Rule* a, ninja::Rule* b) {
      return a->getName() < b->getName();
    });
  std::cout << "  \"rules\": {\n";
  for (auto it = rules.begin(), ie = rules.end(); it != ie; ++it) {
    auto rule = *it;
    if (it != rules.begin()) std::cout << ",\n";
    std::cout << "    \"" << escapeForJSON(rule->getName()) << "\": {\n";

    std::vector<std::pair<std::string, std::string>> parameters;
    for (const auto& entry: rule->getParameters()) {
        parameters.push_back({ entry.getKey(), entry.getValue() });
    }
    std::sort(parameters.begin(), parameters.end());
    for (auto pit = parameters.begin(),
           pie = parameters.end(); pit != pie; ++pit) {
      if (pit != parameters.begin()) std::cout << ",\n";
      std::cout << "      \"" << escapeForJSON(pit->first) << "\": \""
                << escapeForJSON(pit->second) << "\"";
    }
    std::cout << "\n    }";
  }
  std::cout << "\n  },\n";

  // Dump the default targets, if specified.
  if (!manifest->getDefaultTargets().empty()) {
    std::vector<ninja::Node*> defaultTargets = manifest->getDefaultTargets();
    std::sort(defaultTargets.begin(), defaultTargets.end(),
              [] (ninja::Node* a, ninja::Node* b) {
        return a->getScreenPath() < b->getScreenPath();
      });
    std::cout << "  \"default_targets\": [";
    for (auto it = defaultTargets.begin(),
           ie = defaultTargets.end(); it != ie; ++it) {
      if (it != defaultTargets.begin()) std::cout << ", ";
      std::cout << "\"" << escapeForJSON((*it)->getScreenPath()) << "\"";
    }
    std::cout << "],\n";
  }

  // Dump the commands.
  std::vector<ninja::Command*> commands(manifest->getCommands());
  std::sort(commands.begin(), commands.end(),
            [] (ninja::Command* a, ninja::Command* b) {
              // Commands can not have duplicate outputs, so comparing based
              // only on the first still provides a total ordering.
              return a->getOutputs()[0]->getScreenPath() <
                b->getOutputs()[0]->getScreenPath();
            });
  std::cout << "  \"commands\": [\n";
  for (auto it = commands.begin(), ie = commands.end(); it != ie; ++it) {
    auto command = *it;
    if (it != commands.begin()) std::cout << ",\n";
    std::cout << "    {\n";
    std::cout << "      \"outputs\": [";
    for (auto it = command->getOutputs().begin(),
           ie = command->getOutputs().end(); it != ie; ++it) {
      if (it != command->getOutputs().begin()) std::cout << ", ";
      std::cout << "\"" << escapeForJSON((*it)->getScreenPath()) << "\"";
    }
    std::cout << "],\n";
    std::cout << "      \"rule\": \""
              << command->getRule()->getName() << "\",\n";

    std::cout << "      \"inputs\": [";
    for (auto it = command->explicitInputs_begin(),
           ie = command->explicitInputs_end(); it != ie; ++it) {
      if (it != command->explicitInputs_begin()) std::cout << ", ";
      std::cout << "\"" << escapeForJSON((*it)->getScreenPath()) << "\"";
    }
    std::cout << "],\n";
    if (command->getNumImplicitInputs()) {
      std::cout << "      \"implicit_inputs\": [";
      for (auto it = command->implicitInputs_begin(),
             ie = command->implicitInputs_end(); it != ie; ++it) {
        if (it != command->implicitInputs_begin()) std::cout << ", ";
        std::cout << "\"" << escapeForJSON((*it)->getScreenPath()) << "\"";
      }
      std::cout << "],\n";
    }
    if (command->getNumOrderOnlyInputs()) {
      std::cout << "      \"order_only_inputs\": [";
      for (auto it = command->orderOnlyInputs_begin(),
             ie = command->orderOnlyInputs_end(); it != ie; ++it) {
        if (it != command->orderOnlyInputs_begin()) std::cout << ", ";
        std::cout << "\"" << escapeForJSON((*it)->getScreenPath()) << "\"";
      }
      std::cout << "],\n";
    }

    // Write out optional things.
    if (command->hasGeneratorFlag())
      std::cout << "      \"generator\": true,\n";
    if (command->hasRestatFlag())
      std::cout << "      \"restat\": true,\n";

    if (const ninja::Pool* executionPool = command->getExecutionPool()) {
      std::cout << "      \"pool\": \""
                << escapeForJSON(executionPool->getName()) << "\",\n";
    }

    switch (command->getDepsStyle()) {
    case ninja::Command::DepsStyleKind::None:
      break;
    case ninja::Command::DepsStyleKind::GCC:
      std::cout << "      \"deps\": \"gcc\",\n";
      std::cout << "      \"depfile\": \""
                << escapeForJSON(command->getDepsFile()) << "\",\n";
      break;
    case ninja::Command::DepsStyleKind::MSVC:
      std::cout << "      \"deps\": \"msvc\",\n";
      break;
    }
    
    // Finally, write out the attributes.
    std::cout << "      \"command\": \""
              << escapeForJSON(command->getCommandString()) << "\",\n";
    std::cout << "      \"description\": \""
              << escapeForJSON(command->getDescription()) << "\"\n";
    
    std::cout << "    }";
  }
  std::cout << "\n  ]\n";

  std::cout << "}\n";
}